

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O0

void predict_or_learn_logistic<true>(boosting *o,single_learner *base,example *ec)

{
  float fVar1;
  reference pvVar2;
  EVP_PKEY_CTX *in_RDX;
  size_t *extraout_RDX;
  size_t *siglen;
  size_t *extraout_RDX_00;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *sig;
  EVP_PKEY_CTX *in_RDI;
  EVP_PKEY_CTX *ctx;
  size_t in_R8;
  float fVar3;
  undefined4 extraout_XMM0_Da;
  double dVar4;
  float z;
  float w;
  int i;
  float eta;
  float u;
  float s;
  float final_prediction;
  label_data *ld;
  undefined4 in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  int local_34;
  float local_28;
  float local_24;
  
  local_24 = 0.0;
  local_28 = 0.0;
  fVar1 = *(float *)(in_RDX + 0x6870);
  *(int *)(in_RDI + 0x78) = *(int *)(in_RDI + 0x78) + 1;
  sig = in_RSI;
  ctx = in_RDI;
  fVar3 = sqrtf((float)*(int *)(in_RDI + 0x78));
  siglen = extraout_RDX;
  for (local_34 = 0; local_34 < *(int *)in_RDI; local_34 = local_34 + 1) {
    dVar4 = std::exp((double)(ulong)(uint)local_28);
    *(float *)(in_RDX + 0x6870) = fVar1 * (1.0 / (SUB84(dVar4,0) + 1.0));
    LEARNER::learner<char,_example>::predict
              ((learner<char,_example> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (example *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    in_stack_ffffffffffffffb4 = *(float *)(in_RDX + 0x6828) * *(float *)(in_RDX + 0x6850);
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffb4;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x48),(long)local_34);
    local_28 = in_stack_ffffffffffffffb4 * *pvVar2 + local_28;
    in_stack_ffffffffffffffb8 = *(float *)(in_RDX + 0x6850);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x48),(long)local_34);
    local_24 = in_stack_ffffffffffffffb8 * *pvVar2 + local_24;
    in_stack_ffffffffffffffbc = (4.0 / fVar3) * in_stack_ffffffffffffffc4;
    dVar4 = std::exp((double)(ulong)(uint)local_28);
    in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffbc / (SUB84(dVar4,0) + 1.0);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x48),(long)local_34);
    *pvVar2 = in_stack_ffffffffffffffc0 + *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x48),(long)local_34);
    if (2.0 < *pvVar2) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x48),(long)local_34);
      *pvVar2 = 2.0;
    }
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x48),(long)local_34);
    if (*pvVar2 < -2.0) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x48),(long)local_34);
      *pvVar2 = -2.0;
    }
    sig = in_RDX;
    ctx = in_RSI;
    LEARNER::learner<char,_example>::learn
              ((learner<char,_example> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (example *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    siglen = extraout_RDX_00;
  }
  *(float *)(in_RDX + 0x6870) = fVar1;
  *(float *)(in_RDX + 0x68a8) = local_24;
  sign(ctx,(uchar *)sig,siglen,(uchar *)in_RDI,in_R8);
  *(undefined4 *)(in_RDX + 0x6850) = extraout_XMM0_Da;
  fVar1 = *(float *)(in_RDX + 0x6828);
  if ((fVar1 != *(float *)(in_RDX + 0x6850)) || (NAN(fVar1) || NAN(*(float *)(in_RDX + 0x6850)))) {
    *(undefined4 *)(in_RDX + 0x68b0) = *(undefined4 *)(in_RDX + 0x6870);
  }
  else {
    *(undefined4 *)(in_RDX + 0x68b0) = 0;
  }
  return;
}

Assistant:

void predict_or_learn_logistic(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0;

  float s = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;
  float eta = 4.f / sqrtf((float)o.t);

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float w = 1 / (1 + correctedExp(s));

      ec.weight = u * w;

      base.predict(ec, i);
      float z;
      z = ld.label * ec.pred.scalar;

      s += z * o.alpha[i];

      // if ld.label * ec.pred.scalar < 0, learner i made a mistake

      final_prediction += ec.pred.scalar * o.alpha[i];

      // update alpha
      o.alpha[i] += eta * z / (1 + correctedExp(s));
      if (o.alpha[i] > 2.)
        o.alpha[i] = 2;
      if (o.alpha[i] < -2.)
        o.alpha[i] = -2;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      final_prediction += ec.pred.scalar * o.alpha[i];
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}